

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O1

void tester_mq_send(mqd_t tester_mq,char *word,_Bool completed,size_t total_processed,_Bool ignored,
                   _Bool accepted,_Bool *err)

{
  int iVar1;
  size_t __n;
  undefined3 in_register_00000089;
  char local_438 [8];
  size_t local_430;
  undefined1 local_428;
  undefined1 local_427;
  undefined1 local_426 [1006];
  mqd_t local_38;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,accepted);
  local_38 = tester_mq;
  memset(local_438,0,0x400);
  local_427 = (undefined1)local_34;
  local_438[0] = completed;
  local_430 = total_processed;
  local_428 = ignored;
  memset(local_426,0,0x3e9);
  if (word != (char *)0x0) {
    __n = strlen(word);
    memcpy(local_426,word,__n);
  }
  iVar1 = mq_send(local_38,local_438,0x400,1);
  if (iVar1 == -1) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                  ,"tester_mq_send");
  }
  return;
}

Assistant:

void tester_mq_send(mqd_t tester_mq, const char *word, bool completed, size_t total_processed, bool ignored, bool accepted,
                    bool *err) {
    assert(err != NULL);

    int tmp_err = 0;
    tester_mq_msg msg;
    memset(&msg, 0, sizeof(tester_mq_msg)); // to prevent valgrind errors
    msg = (tester_mq_msg){completed, total_processed, ignored, accepted, ""};
    if(word != NULL) {
        memcpy(msg.word, word, strlen(word));
    }

    tmp_err = mq_send(tester_mq, (const char *)&msg, sizeof(tester_mq_msg), NORMAL_MQ_PRIORITY);
    VOID_FAIL_IF(tmp_err == -1);
}